

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  ImFontGlyph *pIVar6;
  undefined6 in_register_0000000a;
  float fVar7;
  float fVar8;
  float local_58;
  float fStack_54;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  if ((0x20 < (uint)CONCAT62(in_register_0000000a,c)) ||
     ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) {
    pIVar6 = FindGlyph(this,c);
    local_58 = pos.x;
    fStack_54 = pos.y;
    if (pIVar6 != (ImFontGlyph *)0x0) {
      fVar5 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                     ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
      fVar7 = (this->DisplayOffset).x + (float)(int)local_58;
      fVar8 = (this->DisplayOffset).y + (float)(int)fStack_54;
      ImDrawList::PrimReserve(draw_list,6,4);
      uVar1 = pIVar6->X0;
      uVar3 = pIVar6->Y0;
      local_28.x = (float)uVar1 * fVar5 + fVar7;
      local_28.y = (float)uVar3 * fVar5 + fVar8;
      uVar2 = pIVar6->X1;
      uVar4 = pIVar6->Y1;
      local_30.x = (float)uVar2 * fVar5 + fVar7;
      local_30.y = (float)uVar4 * fVar5 + fVar8;
      local_38.x = pIVar6->U0;
      local_38.y = pIVar6->V0;
      local_40.x = pIVar6->U1;
      local_40.y = pIVar6->V1;
      ImDrawList::PrimRectUV(draw_list,&local_28,&local_30,&local_38,&local_40,col);
    }
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const ImFontGlyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}